

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two-masters.cpp
# Opt level: O1

void TestSerializationImpl<std::vector<float,std::allocator<float>>>
               (vector<float,_std::allocator<float>_> *obj)

{
  pointer *ppBVar1;
  iterator iVar2;
  BlockID BVar3;
  BlockID BVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  QueuePolicy *q_policy;
  Link *l;
  anon_class_1_0_00000001 local_1801;
  BlockID neighbor;
  vector<int,_std::allocator<int>_> gids;
  _Any_data local_17d8;
  code *local_17c8;
  code *local_17c0;
  Block<std::vector<float,_std::allocator<float>_>_> block;
  communicator comm;
  _Any_data local_1768;
  code *local_1758;
  undefined8 uStack_1750;
  _Any_data local_1748;
  code *local_1738;
  undefined8 uStack_1730;
  _Any_data local_1728;
  code *local_1718;
  undefined8 uStack_1710;
  _Any_data local_1708;
  code *local_16f8;
  undefined8 uStack_16f0;
  communicator local_16e0;
  _Any_data local_16c8;
  code *local_16b8;
  code *pcStack_16b0;
  _Any_data local_16a8;
  code *local_1698;
  code *pcStack_1690;
  _Any_data local_1688;
  code *local_1678;
  code *pcStack_1670;
  Master master;
  
  comm.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  comm.rank_ = 0;
  comm.size_ = 1;
  comm.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(comm.comm_.data,&comm.size_);
  block.received.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  block.received.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  block.send.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  block.received.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  block.send.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  block.send.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_16e0.comm_.data = comm.comm_.data;
  local_16e0.rank_ = comm.rank_;
  local_16e0.size_ = comm.size_;
  local_16e0.owner_ = false;
  local_1708._M_unused._M_object = (void *)0x0;
  local_1708._8_8_ = 0;
  local_16f8 = (code *)0x0;
  uStack_16f0 = 0;
  local_1728._M_unused._M_object = (void *)0x0;
  local_1728._8_8_ = 0;
  local_1718 = (code *)0x0;
  uStack_1710 = 0;
  local_1748._M_unused._M_object = (void *)0x0;
  local_1748._8_8_ = 0;
  local_1738 = (code *)0x0;
  uStack_1730 = 0;
  local_1758 = (code *)0x0;
  uStack_1750 = 0;
  local_1768._M_unused._M_object = (void *)0x0;
  local_1768._8_8_ = 0;
  q_policy = (QueuePolicy *)operator_new(0x10);
  q_policy->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_001407a8;
  q_policy[1]._vptr_QueuePolicy = (_func_int **)0x1000;
  diy::Master::Master(&master,&local_16e0,1,-1,(CreateBlock *)&local_1708,
                      (DestroyBlock *)&local_1728,(ExternalStorage *)0x0,(SaveBlock *)&local_1748,
                      (LoadBlock *)&local_1768,q_policy);
  if (local_1758 != (code *)0x0) {
    (*local_1758)(&local_1768,&local_1768,__destroy_functor);
  }
  if (local_1738 != (code *)0x0) {
    (*local_1738)(&local_1748,&local_1748,__destroy_functor);
  }
  if (local_1718 != (code *)0x0) {
    (*local_1718)(&local_1728,&local_1728,__destroy_functor);
  }
  if (local_16f8 != (code *)0x0) {
    (*local_16f8)(&local_1708,&local_1708,__destroy_functor);
  }
  diy::mpi::communicator::~communicator(&local_16e0);
  iVar6 = comm.size_;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_17d8._0_4_ = comm.rank_;
  if (comm.rank_ < comm.size_) {
    iVar7 = comm.rank_;
    do {
      if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&gids,
                   (iterator)
                   gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_17d8._M_pod_data);
      }
      else {
        *gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar7;
        gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish + 1;
      }
      uVar5 = local_17d8._0_4_;
      iVar7 = local_17d8._0_4_ + iVar6;
      local_17d8._0_4_ = iVar7;
    } while ((int)uVar5 < 0);
  }
  iVar7 = *gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  l = (Link *)operator_new(0x20);
  (l->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__001404a8;
  (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  neighbor.gid = 0;
  if (iVar7 < iVar6 + -1) {
    neighbor.gid = iVar7 + 1;
  }
  neighbor.proc = neighbor.gid % iVar6;
  iVar2._M_current =
       (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<diy::BlockID,std::allocator<diy::BlockID>>::_M_realloc_insert<diy::BlockID_const&>
              ((vector<diy::BlockID,std::allocator<diy::BlockID>> *)&l->neighbors_,iVar2,&neighbor);
  }
  else {
    BVar3.proc = neighbor.proc;
    BVar3.gid = neighbor.gid;
    *iVar2._M_current = BVar3;
    ppBVar1 = &(l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
  }
  neighbor.gid = iVar6 + -1;
  if (0 < iVar7) {
    neighbor.gid = iVar7 + -1;
  }
  neighbor.proc = neighbor.gid % iVar6;
  iVar2._M_current =
       (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<diy::BlockID,std::allocator<diy::BlockID>>::_M_realloc_insert<diy::BlockID_const&>
              ((vector<diy::BlockID,std::allocator<diy::BlockID>> *)&l->neighbors_,iVar2,&neighbor);
  }
  else {
    BVar4.proc = neighbor.proc;
    BVar4.gid = neighbor.gid;
    *iVar2._M_current = BVar4;
    ppBVar1 = &(l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
  }
  std::vector<float,_std::allocator<float>_>::operator=(&block.send,obj);
  diy::Master::add(&master,iVar7,&block,l);
  local_17d8._M_unused._M_object = (void *)0x0;
  local_17d8._8_8_ = 0;
  local_17c0 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
               _M_invoke;
  local_17c8 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
               _M_manager;
  diy::Master::
  foreach<TestSerializationImpl<std::vector<float,std::allocator<float>>>(std::vector<float,std::allocator<float>>const&)::_lambda(Block<std::vector<float,std::allocator<float>>>*,diy::Master::ProxyWithLink_const&)_1_>
            (&master,&local_1801,(Skip *)&local_17d8);
  if (local_17c8 != (code *)0x0) {
    (*local_17c8)(&local_17d8,&local_17d8,__destroy_functor);
  }
  local_16c8._M_unused._M_object = (void *)0x0;
  local_16c8._8_8_ = 0;
  local_16a8._M_unused._M_object = (void *)0x0;
  local_16a8._8_8_ = 0;
  local_1688._M_unused._M_object = (void *)0x0;
  local_1688._8_8_ = 0;
  pcStack_16b0 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
  local_16b8 = std::
               _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
               ::_M_manager;
  pcStack_1690 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
  local_1698 = std::
               _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
               ::_M_manager;
  pcStack_1670 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
  local_1678 = std::
               _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
               ::_M_manager;
  diy::Master::exchange(&master,false,(MemoryManagement *)&local_16c8);
  if (local_1678 != (code *)0x0) {
    (*local_1678)(&local_1688,&local_1688,__destroy_functor);
  }
  if (local_1698 != (code *)0x0) {
    (*local_1698)(&local_16a8,&local_16a8,__destroy_functor);
  }
  if (local_16b8 != (code *)0x0) {
    (*local_16b8)(&local_16c8,&local_16c8,__destroy_functor);
  }
  local_17d8._M_unused._M_object = (void *)0x0;
  local_17d8._8_8_ = 0;
  local_17c0 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
               _M_invoke;
  local_17c8 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
               _M_manager;
  diy::Master::
  foreach<TestSerializationImpl<std::vector<float,std::allocator<float>>>(std::vector<float,std::allocator<float>>const&)::_lambda(Block<std::vector<float,std::allocator<float>>>*,diy::Master::ProxyWithLink_const&)_2_>
            (&master,&local_1801,(Skip *)&local_17d8);
  if (local_17c8 != (code *)0x0) {
    (*local_17c8)(&local_17d8,&local_17d8,__destroy_functor);
  }
  if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  diy::Master::~Master(&master);
  TestEqual<float>(&block.send,&block.received);
  if (block.received.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(block.received.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)block.received.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)block.received.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (block.send.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(block.send.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)block.send.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)block.send.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  diy::mpi::communicator::~communicator(&comm);
  return;
}

Assistant:

void TestSerializationImpl(const T& obj)
{
  diy::mpi::communicator comm;
  Block<T> block;

  {
  diy::Master master(comm);

  auto nblocks = comm.size();
  diy::RoundRobinAssigner assigner(comm.size(), nblocks);

  std::vector<int> gids;
  assigner.local_gids(comm.rank(), gids);
  assert(gids.size() == 1);
  auto gid = gids[0];

  diy::Link* link = new diy::Link;
  diy::BlockID neighbor;

  // send neighbor
  neighbor.gid = (gid < (nblocks - 1)) ? (gid + 1) : 0;
  neighbor.proc = assigner.rank(neighbor.gid);
  link->add_neighbor(neighbor);

  // recv neighbor
  neighbor.gid = (gid > 0) ? (gid - 1) : (nblocks - 1);
  neighbor.proc = assigner.rank(neighbor.gid);
  link->add_neighbor(neighbor);

  block.send = obj;
  master.add(gid, &block, link);

  // compute, exchange, compute
  master.foreach([](Block<T> *b, const diy::Master::ProxyWithLink& cp) {
    cp.enqueue(cp.link()->target(0), b->send);
  });
  master.exchange();
  master.foreach([](Block<T> *b, const diy::Master::ProxyWithLink& cp) {
    cp.dequeue(cp.link()->target(1).gid, b->received);
  });

  //comm.barrier();
  }

  TestEqual(block.send, block.received);
}